

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O0

void __thiscall
iutest::detail::
TypeParamTestInstance<iu_TypedTest2_x_iutest_x_StaticMul2_Test,_iutest::detail::TypeList1<float>_>::
EachTest<iutest::detail::TypeList1<float>,_void>::EachTest
          (EachTest<iutest::detail::TypeList1<float>,_void> *this,string *testsuite,char *name,
          size_t index,char *file,int line)

{
  size_t __s;
  TestSuite *p;
  allocator<char> local_59;
  string local_58;
  int local_34;
  char *pcStack_30;
  int line_local;
  char *file_local;
  size_t index_local;
  char *name_local;
  string *testsuite_local;
  EachTest<iutest::detail::TypeList1<float>,_void> *this_local;
  
  local_34 = line;
  pcStack_30 = file;
  file_local = (char *)index;
  index_local = (size_t)name;
  name_local = (char *)testsuite;
  testsuite_local = (string *)this;
  p = AddTestSuite(testsuite,index,file,line);
  TestSuiteMediator::TestSuiteMediator(&this->m_mediator,p);
  __s = index_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,(char *)__s,&local_59);
  TestInfo::TestInfo(&this->m_info,(iuITestSuiteMediator *)this,&local_58,
                     &(this->m_factory).super_iuFactoryBase);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  iuFactory<iu_TypedTest2_x_iutest_x_StaticMul2_Test<float>_>::iuFactory(&this->m_factory);
  TypeParamTestInstance<iu_TypedTest2_x_iutest_x_StaticMul2_Test,_iutest::detail::TypeList1<float>_>
  ::EachTest<iutest::detail::TypeList0,_void>::EachTest
            ((EachTest<iutest::detail::TypeList0,_void> *)&this->field_0xd0,(string *)name_local,
             (char *)index_local,(size_t)(file_local + 1),pcStack_30,local_34);
  return;
}

Assistant:

EachTest(const ::std::string& testsuite, const char* name, size_t index, const char* file, int line)
            : m_mediator(AddTestSuite(testsuite, index, file, line))
            , m_info(&m_mediator, name, &m_factory)
            , m_next(testsuite, name, index+1, file, line)
        {
        }